

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O0

void __thiscall
GlobOpt::SetObjectTypeFromTypeSym(GlobOpt *this,StackSym *typeSym,Value *value,BasicBlock *block)

{
  BVIndex i;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ValueInfo *pVVar4;
  BasicBlock *pBStack_28;
  SymID typeSymId;
  BasicBlock *block_local;
  Value *value_local;
  StackSym *typeSym_local;
  GlobOpt *this_local;
  
  if (typeSym == (StackSym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x73c,"(typeSym != nullptr)","typeSym != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (value == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x73d,"(value != nullptr)","value != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pVVar4 = ::Value::GetValueInfo(value);
  if (pVVar4 != (ValueInfo *)0x0) {
    pVVar4 = ::Value::GetValueInfo(value);
    bVar2 = ValueInfo::IsJsType(pVVar4);
    if (bVar2) goto LAB_006048fb;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar3 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                     ,0x73e,
                     "(value->GetValueInfo() != nullptr && value->GetValueInfo()->IsJsType())",
                     "value->GetValueInfo() != nullptr && value->GetValueInfo()->IsJsType()");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar3 = 0;
LAB_006048fb:
  i = (typeSym->super_Sym).m_id;
  pBStack_28 = block;
  if (block == (BasicBlock *)0x0) {
    pBStack_28 = this->currentBlock;
  }
  GlobOptBlockData::SetValue(&pBStack_28->globOptData,value,&typeSym->super_Sym);
  BVSparse<Memory::JitArenaAllocator>::Set((pBStack_28->globOptData).liveFields,i);
  return;
}

Assistant:

void
GlobOpt::SetObjectTypeFromTypeSym(StackSym *typeSym, Value* value, BasicBlock* block)
{
    Assert(typeSym != nullptr);
    Assert(value != nullptr);
    Assert(value->GetValueInfo() != nullptr && value->GetValueInfo()->IsJsType());

    SymID typeSymId = typeSym->m_id;

    if (block == nullptr)
    {
        block = this->currentBlock;
    }

    block->globOptData.SetValue(value, typeSym);
    block->globOptData.liveFields->Set(typeSymId);
}